

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int nsPush(xmlParserCtxtPtr ctxt,xmlChar *prefix,xmlChar *URL)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  xmlChar **ppxVar5;
  
  if ((ctxt->options & 0x2000) != 0) {
    uVar4 = (ulong)(uint)ctxt->nsNr;
    do {
      if ((int)uVar4 < 2) goto LAB_00165c4d;
      uVar1 = uVar4 - 2;
      lVar3 = uVar4 - 2;
      uVar4 = uVar1;
    } while (ctxt->nsTab[lVar3] != prefix);
    if (ctxt->nsTab[(ulong)((int)uVar1 + 2U & 0x7fffffff) - 1] == URL) {
      return -2;
    }
  }
LAB_00165c4d:
  iVar2 = ctxt->nsMax;
  if (((long)iVar2 == 0) || (ppxVar5 = ctxt->nsTab, ppxVar5 == (xmlChar **)0x0)) {
    ctxt->nsNr = 0;
    ctxt->nsMax = 10;
    ppxVar5 = (xmlChar **)(*xmlMalloc)(0x50);
    ctxt->nsTab = ppxVar5;
    if (ppxVar5 == (xmlChar **)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      ctxt->nsMax = 0;
      return -1;
    }
  }
  else if (iVar2 <= ctxt->nsNr) {
    ctxt->nsMax = iVar2 * 2;
    ppxVar5 = (xmlChar **)(*xmlRealloc)(ppxVar5,(long)iVar2 << 4);
    if (ppxVar5 == (xmlChar **)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      ctxt->nsMax = ctxt->nsMax / 2;
      return -1;
    }
    ctxt->nsTab = ppxVar5;
  }
  iVar2 = ctxt->nsNr;
  ppxVar5[iVar2] = prefix;
  ctxt->nsNr = iVar2 + 2;
  ctxt->nsTab[(long)iVar2 + 1] = URL;
  return iVar2 + 2;
}

Assistant:

static int
nsPush(xmlParserCtxtPtr ctxt, const xmlChar *prefix, const xmlChar *URL)
{
    if (ctxt->options & XML_PARSE_NSCLEAN) {
        int i;
	for (i = ctxt->nsNr - 2;i >= 0;i -= 2) {
	    if (ctxt->nsTab[i] == prefix) {
		/* in scope */
	        if (ctxt->nsTab[i + 1] == URL)
		    return(-2);
		/* out of scope keep it */
		break;
	    }
	}
    }
    if ((ctxt->nsMax == 0) || (ctxt->nsTab == NULL)) {
	ctxt->nsMax = 10;
	ctxt->nsNr = 0;
	ctxt->nsTab = (const xmlChar **)
	              xmlMalloc(ctxt->nsMax * sizeof(xmlChar *));
	if (ctxt->nsTab == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    ctxt->nsMax = 0;
            return (-1);
	}
    } else if (ctxt->nsNr >= ctxt->nsMax) {
        const xmlChar ** tmp;
        ctxt->nsMax *= 2;
        tmp = (const xmlChar **) xmlRealloc((char *) ctxt->nsTab,
				    ctxt->nsMax * sizeof(ctxt->nsTab[0]));
        if (tmp == NULL) {
            xmlErrMemory(ctxt, NULL);
	    ctxt->nsMax /= 2;
            return (-1);
        }
	ctxt->nsTab = tmp;
    }
    ctxt->nsTab[ctxt->nsNr++] = prefix;
    ctxt->nsTab[ctxt->nsNr++] = URL;
    return (ctxt->nsNr);
}